

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O2

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,uint n)

{
  StringBuffer *pSVar1;
  size_t in_RCX;
  void *__buf;
  char fbuf [64];
  char acStack_58 [72];
  
  uitoa<unsigned_int>(n,acStack_58);
  pSVar1 = (StringBuffer *)write(this,(int)acStack_58,__buf,in_RCX);
  return pSVar1;
}

Assistant:

StringBuffer& operator<<(unsigned int n)       { _UITOA(n); }